

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

void Imf_2_5::copyFromDeepFrameBuffer
               (char **writePtr,char *base,char *sampleCountBase,ptrdiff_t sampleCountXStride,
               ptrdiff_t sampleCountYStride,int y,int xMin,int xMax,int xOffsetForSampleCount,
               int yOffsetForSampleCount,int xOffsetForData,int yOffsetForData,
               ptrdiff_t sampleStride,ptrdiff_t dataXStride,ptrdiff_t dataYStride,Format format,
               PixelType type)

{
  char cVar1;
  ArgExc *this;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t j;
  long lVar6;
  long lVar7;
  char *pcVar8;
  undefined4 *puVar9;
  undefined2 *puVar10;
  int iVar11;
  undefined2 local_3a;
  undefined4 local_38;
  undefined4 local_34;
  
  iVar4 = (int)sampleCountYStride;
  iVar2 = (int)sampleCountXStride;
  if (format == XDR) {
    if (type == UINT) {
      if (xMin <= xMax) {
        lVar5 = (long)xMin;
        do {
          iVar3 = *(int *)(sampleCountBase +
                          (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                          (long)iVar4 * (long)(y - yOffsetForSampleCount));
          if (iVar3 != 0) {
            puVar9 = *(undefined4 **)
                      (base + (lVar5 - xOffsetForData) * dataXStride +
                              (y - yOffsetForData) * dataYStride);
            iVar11 = 0;
            do {
              local_38 = *puVar9;
              lVar6 = 0;
              do {
                cVar1 = *(char *)((long)&local_38 + lVar6);
                pcVar8 = *writePtr;
                *writePtr = pcVar8 + 1;
                *pcVar8 = cVar1;
                lVar6 = lVar6 + 1;
              } while ((int)lVar6 != 4);
              puVar9 = (undefined4 *)((long)puVar9 + sampleStride);
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar3);
          }
          lVar5 = lVar5 + 1;
        } while (xMax + 1 != (int)lVar5);
      }
    }
    else if (type == HALF) {
      if (xMin <= xMax) {
        lVar5 = (long)xMin;
        do {
          iVar3 = *(int *)(sampleCountBase +
                          (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                          (long)iVar4 * (long)(y - yOffsetForSampleCount));
          if (iVar3 != 0) {
            puVar10 = *(undefined2 **)
                       (base + (lVar5 - xOffsetForData) * dataXStride +
                               (y - yOffsetForData) * dataYStride);
            iVar11 = 0;
            do {
              local_3a = *puVar10;
              lVar6 = 0;
              do {
                cVar1 = *(char *)((long)&local_3a + lVar6);
                pcVar8 = *writePtr;
                *writePtr = pcVar8 + 1;
                *pcVar8 = cVar1;
                lVar6 = lVar6 + 1;
              } while ((int)lVar6 != 2);
              puVar10 = (undefined2 *)((long)puVar10 + sampleStride);
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar3);
          }
          lVar5 = lVar5 + 1;
        } while (xMax + 1 != (int)lVar5);
      }
    }
    else {
      if (type != FLOAT) {
LAB_0041cd80:
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if (xMin <= xMax) {
        lVar5 = (long)xMin;
        do {
          iVar3 = *(int *)(sampleCountBase +
                          (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                          (long)iVar4 * (long)(y - yOffsetForSampleCount));
          if (iVar3 != 0) {
            puVar9 = *(undefined4 **)
                      (base + (lVar5 - xOffsetForData) * dataXStride +
                              (y - yOffsetForData) * dataYStride);
            iVar11 = 0;
            do {
              local_34 = *puVar9;
              lVar6 = 0;
              do {
                cVar1 = *(char *)((long)&local_34 + lVar6);
                pcVar8 = *writePtr;
                *writePtr = pcVar8 + 1;
                *pcVar8 = cVar1;
                lVar6 = lVar6 + 1;
              } while ((int)lVar6 != 4);
              puVar9 = (undefined4 *)((long)puVar9 + sampleStride);
              iVar11 = iVar11 + 1;
            } while (iVar11 != iVar3);
          }
          lVar5 = lVar5 + 1;
        } while (xMax + 1 != (int)lVar5);
      }
    }
  }
  else if (type == UINT) {
    if (xMin <= xMax) {
      lVar5 = (long)xMin;
      do {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar4 * (long)(y - yOffsetForSampleCount));
        if (iVar3 != 0) {
          lVar6 = *(long *)(base + (lVar5 - xOffsetForData) * dataXStride +
                                   (y - yOffsetForData) * dataYStride);
          iVar11 = 0;
          do {
            lVar7 = 0;
            do {
              cVar1 = *(char *)(lVar6 + lVar7);
              pcVar8 = *writePtr;
              *writePtr = pcVar8 + 1;
              *pcVar8 = cVar1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            lVar6 = lVar6 + sampleStride;
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar3);
        }
        lVar5 = lVar5 + 1;
      } while (xMax + 1 != (int)lVar5);
    }
  }
  else if (type == HALF) {
    if (xMin <= xMax) {
      pcVar8 = *writePtr;
      lVar5 = (long)xMin;
      do {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar4 * (long)(y - yOffsetForSampleCount));
        if (iVar3 != 0) {
          puVar10 = *(undefined2 **)
                     (base + (lVar5 - xOffsetForData) * dataXStride +
                             (y - yOffsetForData) * dataYStride);
          do {
            *(undefined2 *)pcVar8 = *puVar10;
            pcVar8 = pcVar8 + 2;
            puVar10 = (undefined2 *)((long)puVar10 + sampleStride);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
          *writePtr = pcVar8;
        }
        lVar5 = lVar5 + 1;
      } while (xMax + 1 != (int)lVar5);
    }
  }
  else {
    if (type != FLOAT) goto LAB_0041cd80;
    if (xMin <= xMax) {
      lVar5 = (long)xMin;
      do {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar5 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar4 * (long)(y - yOffsetForSampleCount));
        if (iVar3 != 0) {
          lVar6 = *(long *)(base + (lVar5 - xOffsetForData) * dataXStride +
                                   (y - yOffsetForData) * dataYStride);
          iVar11 = 0;
          do {
            lVar7 = 0;
            do {
              cVar1 = *(char *)(lVar6 + lVar7);
              pcVar8 = *writePtr;
              *writePtr = pcVar8 + 1;
              *pcVar8 = cVar1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            lVar6 = lVar6 + sampleStride;
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar3);
        }
        lVar5 = lVar5 + 1;
      } while (xMax + 1 != (int)lVar5);
    }
  }
  return;
}

Assistant:

void
copyFromDeepFrameBuffer (char *& writePtr,
                         const char * base,
                         char* sampleCountBase,
                         ptrdiff_t sampleCountXStride,
                         ptrdiff_t sampleCountYStride,
                         int y, int xMin, int xMax,
                         int xOffsetForSampleCount,
                         int yOffsetForSampleCount,
                         int xOffsetForData,
                         int yOffsetForData,
                         ptrdiff_t sampleStride,
                         ptrdiff_t dataXStride,
                         ptrdiff_t dataYStride,
                         Compressor::Format format,
                         PixelType type)
{
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr,
                                            *(const unsigned int *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const float *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                                                      
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (unsigned int); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    *(half *) writePtr = *(const half *) readPtr;
                    writePtr += sizeof (half);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (float); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}